

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

void render(void)

{
  allocator<Vec3<float>_> *paVar1;
  undefined4 uVar2;
  int iVar3;
  iterator iVar4;
  iterator __last;
  Vec3f *pVVar5;
  reference pvVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  Vec2<float> *local_598;
  Vec3<float> *local_580;
  Vec3<float> *local_550;
  Vec3<float> *local_538;
  allocator<char> local_4e1;
  string local_4e0;
  Vec3<float> local_4c0;
  Vec3<float> local_4b4;
  float local_4a8;
  float maxbis;
  float local_498;
  undefined1 local_494 [4];
  float max;
  Vec3f res;
  Vec3f *cbis;
  Vec3f *c;
  size_t i_1;
  string local_468;
  allocator<char> local_441;
  string local_440;
  undefined1 local_420 [8];
  undefined1 local_418 [20];
  int k;
  Vec2f text [3];
  undefined1 local_3e8 [8];
  Vec3f norms [3];
  Matrix local_3b8;
  Matrix local_398;
  undefined1 local_374 [44];
  Matrix local_348;
  undefined1 local_324 [20];
  int j;
  int i;
  Vec3f pointRight;
  Vec3f pointLeft;
  Vec3f pointsRight [3];
  undefined1 local_2c8 [8];
  Vec3f pointsLeft [3];
  Matrix local_298;
  undefined1 local_278 [8];
  Matrix TotalTransformRight;
  undefined1 local_238 [8];
  Matrix TotalTransformLeft;
  undefined1 local_208 [8];
  Matrix ProjectionRight;
  undefined1 local_1d8 [8];
  Matrix ProjectionLeft;
  Matrix ViewPort;
  Vec3<float> local_188;
  Vec3<float> local_17c;
  undefined1 local_170 [8];
  Matrix ModelViewRight;
  Vec3<float> local_140;
  Vec3<float> local_134;
  undefined1 local_128 [8];
  Matrix ModelViewLeft;
  Vec3f rightEye;
  Vec3f leftEye;
  Vec3f center;
  allocator<float> local_c9;
  undefined1 local_c8 [8];
  vector<float,_std::allocator<float>_> zBufferRight;
  allocator<float> local_91;
  undefined1 local_90 [8];
  vector<float,_std::allocator<float>_> zBufferLeft;
  undefined1 local_70 [8];
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferRightEye;
  undefined1 local_50 [8];
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferLeftEye;
  allocator<Vec3<float>_> local_21;
  undefined1 local_20 [8];
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebuffer;
  
  TGAImage::read_tga_file(&texture,"../res/diablo3_pose_diffuse.tga");
  TGAImage::flip_vertically(&texture);
  std::allocator<Vec3<float>_>::allocator(&local_21);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_20,0x300000,&local_21);
  std::allocator<Vec3<float>_>::~allocator(&local_21);
  paVar1 = (allocator<Vec3<float>_> *)
           ((long)&framebufferRightEye.
                   super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Vec3<float>_>::allocator(paVar1);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_50,0x300000,paVar1);
  std::allocator<Vec3<float>_>::~allocator
            ((allocator<Vec3<float>_> *)
             ((long)&framebufferRightEye.
                     super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<Vec3<float>_> *)
           ((long)&zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Vec3<float>_>::allocator(paVar1);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_70,0x300000,paVar1);
  std::allocator<Vec3<float>_>::~allocator
            ((allocator<Vec3<float>_> *)
             ((long)&zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<float>::allocator(&local_91);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_90,0x300000,&local_91);
  std::allocator<float>::~allocator(&local_91);
  iVar4 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)local_90);
  __last = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)local_90);
  zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = std::numeric_limits<float>::lowest();
  std::fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,float>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar4._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __last._M_current,
             (float *)((long)&zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<float>::allocator(&local_c9);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_c8,0x300000,&local_c9);
  std::allocator<float>::~allocator(&local_c9);
  iVar4 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)local_c8);
  register0x00000000 =
       std::vector<float,_std::allocator<float>_>::end
                 ((vector<float,_std::allocator<float>_> *)local_c8);
  center.y = std::numeric_limits<float>::lowest();
  std::fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,float>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar4._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             stack0xffffffffffffff20,&center.y);
  Vec3<float>::Vec3((Vec3<float> *)&leftEye.y,0.0,0.0,0.0);
  Vec3<float>::Vec3((Vec3<float> *)&rightEye.y,-0.1,0.0,2.5);
  Vec3<float>::Vec3((Vec3<float> *)&ModelViewLeft.rows,0.1,0.0,2.5);
  Vec3<float>::Vec3(&local_134,(Vec3<float> *)&rightEye.y);
  Vec3<float>::Vec3(&local_140,(Vec3<float> *)&leftEye.y);
  Vec3<float>::Vec3((Vec3<float> *)&ModelViewRight.cols,0.0,1.0,0.0);
  lookat((Matrix *)local_128,&local_134,&local_140,(Vec3f *)&ModelViewRight.cols);
  Vec3<float>::Vec3(&local_17c,(Vec3<float> *)&ModelViewLeft.rows);
  Vec3<float>::Vec3(&local_188,(Vec3<float> *)&leftEye.y);
  Vec3<float>::Vec3((Vec3<float> *)&ViewPort.cols,0.0,1.0,0.0);
  lookat((Matrix *)local_170,&local_17c,&local_188,(Vec3f *)&ViewPort.cols);
  viewport((Matrix *)&ProjectionLeft.rows,0x100,0xc0,0x600,0x480);
  Vec3<float>::operator-((Vec3<float> *)&ProjectionRight.cols,(Vec3<float> *)&rightEye.y);
  fVar10 = Vec3<float>::norm((Vec3<float> *)&ProjectionRight.cols);
  projection((Matrix *)local_1d8,fVar10);
  Vec3<float>::operator-((Vec3<float> *)&TotalTransformLeft.cols,(Vec3<float> *)&ModelViewLeft.rows)
  ;
  fVar10 = Vec3<float>::norm((Vec3<float> *)&TotalTransformLeft.cols);
  projection((Matrix *)local_208,fVar10);
  Matrix::operator*((Matrix *)&TotalTransformRight.rows,(Matrix *)&ProjectionLeft.rows,
                    (Matrix *)local_1d8);
  Matrix::operator*((Matrix *)local_238,(Matrix *)&TotalTransformRight.rows,(Matrix *)local_128);
  Matrix::~Matrix((Matrix *)&TotalTransformRight.rows);
  Matrix::operator*(&local_298,(Matrix *)&ProjectionLeft.rows,(Matrix *)local_208);
  Matrix::operator*((Matrix *)local_278,&local_298,(Matrix *)local_170);
  Matrix::~Matrix(&local_298);
  local_538 = (Vec3<float> *)local_2c8;
  do {
    Vec3<float>::Vec3(local_538);
    local_538 = local_538 + 1;
  } while (local_538 != (Vec3<float> *)&pointsLeft[2].y);
  local_550 = (Vec3<float> *)&pointLeft.y;
  do {
    Vec3<float>::Vec3(local_550);
    local_550 = local_550 + 1;
  } while (local_550 != (Vec3<float> *)&pointsRight[2].y);
  Vec3<float>::Vec3((Vec3<float> *)&pointRight.y);
  Vec3<float>::Vec3((Vec3<float> *)&j);
  local_324._16_4_ = 0;
  while( true ) {
    uVar2 = local_324._16_4_;
    iVar3 = Model::nfaces(&diablo);
    if (iVar3 <= (int)uVar2) break;
    for (local_324._12_4_ = 0; (int)local_324._12_4_ < 3; local_324._12_4_ = local_324._12_4_ + 1) {
      iVar3 = Model::vert(&diablo,local_324._16_4_,local_324._12_4_);
      pVVar5 = Model::point(&diablo,iVar3);
      Vec3<float>::operator=((Vec3<float> *)&pointRight.y,pVVar5);
      iVar3 = Model::vert(&diablo,local_324._16_4_,local_324._12_4_);
      pVVar5 = Model::point(&diablo,iVar3);
      Vec3<float>::operator=((Vec3<float> *)&j,pVVar5);
      v2m((Matrix *)(local_374 + 0xc),(Vec3f *)&pointRight.y);
      Matrix::operator*(&local_348,(Matrix *)local_238,(Matrix *)(local_374 + 0xc));
      m2v((Matrix *)local_324);
      Vec3<float>::operator=
                ((Vec3<float> *)&pointsLeft[(long)(int)local_324._12_4_ + -1].y,
                 (Vec3<float> *)local_324);
      Matrix::~Matrix(&local_348);
      Matrix::~Matrix((Matrix *)(local_374 + 0xc));
      v2m(&local_3b8,(Vec3f *)&j);
      Matrix::operator*(&local_398,(Matrix *)local_278,&local_3b8);
      m2v((Matrix *)local_374);
      Vec3<float>::operator=
                ((Vec3<float> *)&pointsRight[(long)(int)local_324._12_4_ + -1].y,
                 (Vec3<float> *)local_374);
      Matrix::~Matrix(&local_398);
      Matrix::~Matrix(&local_3b8);
    }
    local_580 = (Vec3<float> *)local_3e8;
    do {
      Vec3<float>::Vec3(local_580);
      local_580 = local_580 + 1;
    } while (local_580 != (Vec3<float> *)&norms[2].y);
    local_598 = (Vec2<float> *)(local_418 + 0x10);
    do {
      Vec2<float>::Vec2(local_598);
      local_598 = local_598 + 1;
    } while (local_598 != text + 2);
    for (local_418._12_4_ = 0; (int)local_418._12_4_ < 3; local_418._12_4_ = local_418._12_4_ + 1) {
      Model::normal((Model *)local_418,0x1172f0,local_324._16_4_);
      Vec3<float>::operator=
                ((Vec3<float> *)&norms[(long)(int)local_418._12_4_ + -1].y,(Vec3<float> *)local_418)
      ;
      Model::uv((Model *)local_420,0x1172f0,local_324._16_4_);
      Vec2<float>::operator=
                ((Vec2<float> *)(local_418 + (long)(int)local_418._12_4_ * 8 + 0x10),
                 (Vec2<float> *)local_420);
    }
    rasterizeTriangle((Vec3f *)local_2c8,(Vec3f *)local_3e8,(Vec2f *)(local_418 + 0x10),
                      (vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_50,
                      (vector<float,_std::allocator<float>_> *)local_90);
    rasterizeTriangle((Vec3f *)&pointLeft.y,(Vec3f *)local_3e8,(Vec2f *)(local_418 + 0x10),
                      (vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_70,
                      (vector<float,_std::allocator<float>_> *)local_c8);
    local_324._16_4_ = local_324._16_4_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"Left",&local_441);
  writeInFile((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_50,0x800,0x600,&local_440)
  ;
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"Right",(allocator<char> *)((long)&i_1 + 7));
  writeInFile((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_70,0x800,0x600,&local_468)
  ;
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  for (c = (Vec3f *)0x0; c < (Vec3f *)0x300000; c = (Vec3f *)((long)&c->x + 1)) {
    pvVar6 = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                       ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_50,(size_type)c)
    ;
    res._4_8_ = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                          ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_70,
                           (size_type)c);
    Vec3<float>::Vec3((Vec3<float> *)local_494);
    pfVar7 = Vec3<float>::operator[](pvVar6,0);
    pfVar8 = Vec3<float>::operator[](pvVar6,1);
    pfVar9 = Vec3<float>::operator[](pvVar6,2);
    pfVar8 = std::max<float>(pfVar8,pfVar9);
    pfVar7 = std::max<float>(pfVar7,pfVar8);
    local_498 = *pfVar7;
    if (1.0 < local_498) {
      Vec3<float>::operator*((Vec3<float> *)&stack0xfffffffffffffb5c,1.0 / local_498);
      Vec3<float>::operator=(pvVar6,(Vec3<float> *)&stack0xfffffffffffffb5c);
    }
    pfVar7 = Vec3<float>::operator[]((Vec3<float> *)res._4_8_,0);
    pfVar8 = Vec3<float>::operator[]((Vec3<float> *)res._4_8_,1);
    pfVar9 = Vec3<float>::operator[]((Vec3<float> *)res._4_8_,2);
    pfVar8 = std::max<float>(pfVar8,pfVar9);
    pfVar7 = std::max<float>(pfVar7,pfVar8);
    local_4a8 = *pfVar7;
    if (1.0 < local_4a8) {
      Vec3<float>::operator*(&local_4b4,1.0 / local_4a8);
      Vec3<float>::operator=((Vec3<float> *)res._4_8_,&local_4b4);
    }
    Vec3<float>::Vec3(&local_4c0,(pvVar6->x + pvVar6->z) * 0.5,
                      (pvVar6->y + *(float *)(res._4_8_ + 4)) * 0.5,
                      (*(float *)res._4_8_ + *(float *)(res._4_8_ + 8)) * 0.5);
    Vec3<float>::operator=((Vec3<float> *)local_494,&local_4c0);
    pvVar6 = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                       ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_20,(size_type)c)
    ;
    Vec3<float>::operator=(pvVar6,(Vec3<float> *)local_494);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"17",&local_4e1);
  writeInFile((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_20,0x800,0x600,&local_4e0)
  ;
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  Matrix::~Matrix((Matrix *)local_278);
  Matrix::~Matrix((Matrix *)local_238);
  Matrix::~Matrix((Matrix *)local_208);
  Matrix::~Matrix((Matrix *)local_1d8);
  Matrix::~Matrix((Matrix *)&ProjectionLeft.rows);
  Matrix::~Matrix((Matrix *)local_170);
  Matrix::~Matrix((Matrix *)local_128);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_c8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_90);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::~vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_70);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::~vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_50);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::~vector
            ((vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *)local_20);
  return;
}

Assistant:

void render(){
    //std::vector<float> zBuffer(width*height);
    //Vec3f camera = Vec3f(0, 0, 2); // camera.z used in the projection matrix, != 0

    texture.read_tga_file("../res/diablo3_pose_diffuse.tga"); // getting texture
    texture.flip_vertically();
    //std::fill(zBuffer.begin(), zBuffer.end(), std::numeric_limits<float>::lowest()); // filling z-buffer

    std::vector<Vec3f> framebuffer(width*height); //used for the fusion
    std::vector<Vec3f> framebufferLeftEye(width*height); //image used for left eye
    std::vector<Vec3f> framebufferRightEye(width*height);//image used for right eye

    //Matrix VP = viewport((float)width/8, (float)height/8, (float)width*3/4, (float)height*3/4); // getting viewport
    //Matrix P  = projection(camera.z);// getting perspective matrix


    std::vector<float> zBufferLeft(width*height);
    std::fill(zBufferLeft.begin(), zBufferLeft.end(), std::numeric_limits<float>::lowest());
    std::vector<float> zBufferRight(width*height);
    std::fill(zBufferRight.begin(), zBufferRight.end(), std::numeric_limits<float>::lowest());

    Vec3f center(0,0,0);

    Vec3f leftEye(-0.1, 0, 2.5);
    Vec3f rightEye(0.1, 0, 2.5);
    Matrix ModelViewLeft = lookat(leftEye, center, Vec3f(0,1,0));
    Matrix ModelViewRight = lookat(rightEye, center, Vec3f(0,1,0));
    Matrix ViewPort = viewport(width/8, height/8, width*3/4, height*3/4);

    Matrix ProjectionLeft = projection((leftEye - center).norm());
    Matrix ProjectionRight = projection((rightEye - center).norm());

    Matrix TotalTransformLeft = ViewPort * ProjectionLeft * ModelViewLeft;
    Matrix TotalTransformRight = ViewPort * ProjectionRight * ModelViewRight;


    // drawing things here
    Vec3f pointsLeft[nbPoints];
    Vec3f pointsRight[nbPoints];
    Vec3f pointLeft;
    Vec3f pointRight;

    #pragma omp parallel for
    for(int i = 0; i < diablo.nfaces(); i++){   // fetching diablo's mesh
        for(int j = 0; j < nbPoints; j++){
            pointLeft = diablo.point(diablo.vert(i, j));
            pointRight = diablo.point(diablo.vert(i, j));

            pointsLeft[j] = m2v(TotalTransformLeft * v2m(pointLeft));
            pointsRight[j] = m2v(TotalTransformRight * v2m(pointRight));
        }

        Vec3f norms[nbPoints];
        Vec2f text[nbPoints];
        // retrieving normal for each vertices, and textures position
        for(int k = 0 ; k < nbPoints; k++){
            norms[k] = diablo.normal(i, k);
            text[k] = diablo.uv(i, k);
        }
        rasterizeTriangle(pointsLeft, norms, text, framebufferLeftEye, zBufferLeft);
        rasterizeTriangle(pointsRight, norms, text, framebufferRightEye, zBufferRight);
    }

    // generating file
    writeInFile(framebufferLeftEye, width, height, "Left");
    writeInFile(framebufferRightEye, width, height, "Right");

    for (size_t i = 0; i < height * width; ++i) {
        Vec3f &c = framebufferLeftEye[i];
        Vec3f &cbis = framebufferRightEye[i];
        Vec3f res;
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max > 1) c = c * (1. / max);
        float maxbis = std::max(cbis[0], std::max(cbis[1], cbis[2]));
        if (maxbis > 1) cbis = cbis * (1. / maxbis);

        res = Vec3f((c.x + c.z) / 2., (c.y + cbis.y)/2., (cbis.x + cbis.z) / 2.);

        framebuffer[i] = res ;

    }


    writeInFile(framebuffer, width, height, "17");



}